

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<15>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  int *ptr;
  int i;
  int index;
  RepeatedField<int> *array;
  
  if (*field != 0) {
    io::CodedOutputStream::WriteVarint32(output,md->tag);
    io::CodedOutputStream::WriteVarint32(output,*(uint32_t *)((long)field + 0x10));
    for (index = 0; index < *field; index = index + 1) {
      ptr = RepeatedField<int>::Get((RepeatedField<int> *)field,index);
      PrimitiveTypeHelper<7>::Serialize(ptr,output);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}